

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  Expr *p;
  Vdbe *p_00;
  ExprList *pEVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  byte *p_01;
  Select *pSVar11;
  int *piVar12;
  CollSeq *pCVar13;
  Expr *pEVar14;
  u8 uVar15;
  int *prRhsHasNull;
  Op *pOVar16;
  ulong uVar17;
  uint i;
  long lVar18;
  ExprList_item *pEVar19;
  int rRhsHasNull;
  int regToFree;
  int iDummy;
  int local_6c;
  int local_54;
  byte *local_50;
  int *local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  local_54 = 0;
  p = pExpr->pLeft;
  iVar3 = sqlite3ExprCheckIN(pParse,pExpr);
  if (iVar3 != 0) {
    return;
  }
  p_01 = (byte *)exprINAffinity(pParse,pExpr);
  pEVar14 = pExpr->pLeft;
  uVar15 = pEVar14->op;
  if (uVar15 == 0x9d) {
    uVar15 = pEVar14->op2;
  }
  if (uVar15 == 'w') {
    pSVar11 = (pEVar14->x).pSelect;
LAB_00231d20:
    uVar6 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar11->pEList)->pList->nExpr;
  }
  else {
    uVar6 = 1;
    if (uVar15 == 0x9e) {
      pSVar11 = (Select *)&pEVar14->x;
      goto LAB_00231d20;
    }
  }
  piVar12 = (int *)sqlite3DbMallocZero(pParse->db,(long)(int)uVar6 * 5 + 1);
  if (pParse->db->mallocFailed != '\0') goto LAB_002323ec;
  p_00 = pParse->pVdbe;
  prRhsHasNull = &local_54;
  if (destIfFalse == destIfNull) {
    prRhsHasNull = (int *)0x0;
  }
  local_50 = p_01;
  local_48 = piVar12;
  iVar4 = sqlite3FindInIndex(pParse,pExpr,3,prRhsHasNull,piVar12);
  pParse->iCacheLevel = pParse->iCacheLevel + 1;
  iVar5 = exprCodeVector(pParse,p,&local_34);
  iVar3 = iVar5;
  if ((int)uVar6 < 1) {
    if (uVar6 != 0) {
      iVar3 = sqlite3GetTempRange(pParse,uVar6);
    }
  }
  else {
    uVar17 = 0;
    do {
      if (uVar17 != (uint)local_48[uVar17]) {
        if ((uVar6 != (uint)uVar17) &&
           (iVar3 = sqlite3GetTempRange(pParse,uVar6), piVar12 = local_48, 0 < (int)uVar6)) {
          uVar17 = 0;
          do {
            sqlite3VdbeAddOp3(p_00,0x40,iVar5 + (int)uVar17,piVar12[uVar17] + iVar3,0);
            uVar17 = uVar17 + 1;
          } while (uVar6 != uVar17);
        }
        break;
      }
      uVar17 = uVar17 + 1;
    } while (uVar6 != uVar17);
  }
  if (iVar4 == 5) {
    pEVar1 = (pExpr->x).pList;
    pCVar13 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
    uVar6 = sqlite3VdbeMakeLabel((Vdbe *)p_00->pParse);
    iVar4 = 0;
    if (destIfFalse != destIfNull) {
      if (pParse->nTempReg == '\0') {
        iVar4 = pParse->nMem + 1;
        pParse->nMem = iVar4;
      }
      else {
        bVar2 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar2;
        iVar4 = pParse->aTempReg[bVar2];
      }
      sqlite3VdbeAddOp3(p_00,0x54,iVar3,iVar3,iVar4);
    }
    if (0 < pEVar1->nExpr) {
      pEVar19 = pEVar1->a;
      lVar18 = 0;
      do {
        iVar9 = sqlite3ExprCodeTemp(pParse,pEVar19->pExpr,&local_38);
        if ((iVar4 != 0) && (iVar10 = sqlite3ExprCanBeNull(pEVar19->pExpr), iVar10 != 0)) {
          sqlite3VdbeAddOp3(p_00,0x54,iVar4,iVar9,iVar4);
        }
        if ((destIfFalse == destIfNull) && ((long)pEVar1->nExpr + -1 <= lVar18)) {
          iVar9 = sqlite3VdbeAddOp3(p_00,0x4d,iVar3,destIfFalse,iVar9);
          sqlite3VdbeChangeP4(p_00,iVar9,(char *)pCVar13,-2);
          uVar8 = p_00->nOp;
          if (0 < (int)uVar8) {
            bVar2 = *local_50 | 0x10;
LAB_002322b0:
            p_00->aOp[(ulong)uVar8 - 1].p5 = (short)(char)bVar2;
          }
        }
        else {
          iVar9 = sqlite3VdbeAddOp3(p_00,0x4e,iVar3,uVar6,iVar9);
          sqlite3VdbeChangeP4(p_00,iVar9,(char *)pCVar13,-2);
          uVar8 = p_00->nOp;
          if (0 < (int)uVar8) {
            bVar2 = *local_50;
            goto LAB_002322b0;
          }
        }
        sqlite3ReleaseTempReg(pParse,local_38);
        lVar18 = lVar18 + 1;
        pEVar19 = pEVar19 + 1;
      } while (lVar18 < pEVar1->nExpr);
    }
    if (iVar4 == 0) {
      piVar12 = p_00->pParse->aLabel;
      if (piVar12 != (int *)0x0) {
        piVar12[(int)~uVar6] = p_00->nOp;
      }
    }
    else {
      sqlite3VdbeAddOp3(p_00,0x4b,iVar4,destIfNull,0);
      sqlite3VdbeAddOp3(p_00,0xd,0,destIfFalse,0);
      piVar12 = p_00->pParse->aLabel;
      if (piVar12 != (int *)0x0) {
        piVar12[(int)~uVar6] = p_00->nOp;
      }
      sqlite3ReleaseTempReg(pParse,iVar4);
    }
  }
  else {
    uVar7 = 0;
    uVar8 = destIfFalse;
    if (destIfFalse != destIfNull) {
      uVar7 = sqlite3VdbeMakeLabel((Vdbe *)p_00->pParse);
      uVar8 = uVar7;
    }
    if (0 < (int)uVar6) {
      i = 0;
      do {
        pEVar14 = sqlite3VectorFieldSubexpr(pExpr->pLeft,i);
        iVar9 = sqlite3ExprCanBeNull(pEVar14);
        if (iVar9 != 0) {
          sqlite3VdbeAddOp3(p_00,0x4b,iVar3 + i,uVar8,0);
        }
        i = i + 1;
      } while (uVar6 != i);
    }
    if (iVar4 == 1) {
      sqlite3VdbeAddOp3(p_00,0x1f,pExpr->iTable,destIfFalse,iVar3);
      local_6c = sqlite3VdbeAddOp3(p_00,0xd,0,0,0);
    }
    else {
      iVar4 = sqlite3VdbeAddOp3(p_00,0x62,iVar3,uVar6,0);
      sqlite3VdbeChangeP4(p_00,iVar4,(char *)local_50,uVar6);
      if (destIfFalse == destIfNull) {
        iVar4 = sqlite3VdbeAddOp3(p_00,0x1d,pExpr->iTable,destIfFalse,iVar3);
        if (p_00->db->mallocFailed == '\0') {
          pOVar16 = p_00->aOp;
          pOVar16[iVar4].p4type = -3;
          pOVar16[iVar4].p4.i = uVar6;
        }
        goto LAB_002323ca;
      }
      local_6c = sqlite3VdbeAddOp3(p_00,0x1e,pExpr->iTable,0,iVar3);
      if (p_00->db->mallocFailed == '\0') {
        pOVar16 = p_00->aOp;
        pOVar16[local_6c].p4type = -3;
        pOVar16[local_6c].p4.i = uVar6;
      }
    }
    if (uVar6 == 1 && local_54 != 0) {
      sqlite3VdbeAddOp3(p_00,0x4c,local_54,destIfFalse,0);
    }
    if (destIfFalse == destIfNull) {
      sqlite3VdbeAddOp3(p_00,0xd,0,destIfFalse,0);
    }
    if ((uVar7 != 0) && (piVar12 = p_00->pParse->aLabel, piVar12 != (int *)0x0)) {
      piVar12[(int)~uVar7] = p_00->nOp;
    }
    iVar4 = sqlite3VdbeAddOp3(p_00,0x25,pExpr->iTable,destIfFalse,0);
    if ((int)uVar6 < 2) {
      uVar8 = destIfFalse;
      if (0 < (int)uVar6) goto LAB_00232046;
      sqlite3VdbeAddOp3(p_00,0xd,0,destIfNull,0);
    }
    else {
      uVar8 = sqlite3VdbeMakeLabel((Vdbe *)p_00->pParse);
LAB_00232046:
      uVar7 = 0;
      local_3c = iVar4;
      do {
        if (pParse->nTempReg == '\0') {
          iVar4 = pParse->nMem + 1;
          pParse->nMem = iVar4;
        }
        else {
          bVar2 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar2;
          iVar4 = pParse->aTempReg[bVar2];
        }
        pEVar14 = sqlite3VectorFieldSubexpr(p,uVar7);
        pCVar13 = sqlite3ExprCollSeq(pParse,pEVar14);
        sqlite3VdbeAddOp3(p_00,0x60,pExpr->iTable,uVar7,iVar4);
        iVar9 = sqlite3VdbeAddOp3(p_00,0x4d,iVar3 + uVar7,uVar8,iVar4);
        sqlite3VdbeChangeP4(p_00,iVar9,(char *)pCVar13,-2);
        sqlite3ReleaseTempReg(pParse,iVar4);
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
      sqlite3VdbeAddOp3(p_00,0xd,0,destIfNull,0);
      if (1 < (int)uVar6) {
        piVar12 = p_00->pParse->aLabel;
        if (piVar12 != (int *)0x0) {
          piVar12[(int)~uVar8] = p_00->nOp;
        }
        sqlite3VdbeAddOp3(p_00,7,pExpr->iTable,local_3c + 1,0);
        sqlite3VdbeAddOp3(p_00,0xd,0,destIfFalse,0);
      }
    }
    if (p_00->db->mallocFailed == '\0') {
      iVar4 = p_00->nOp + -1;
      if (-1 < local_6c) {
        iVar4 = local_6c;
      }
      pOVar16 = p_00->aOp + iVar4;
    }
    else {
      pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar16->p2 = p_00->nOp;
  }
LAB_002323ca:
  if (iVar3 != iVar5) {
    sqlite3ReleaseTempReg(pParse,iVar3);
  }
  sqlite3ExprCachePop(pParse);
  piVar12 = local_48;
  p_01 = local_50;
LAB_002323ec:
  if (piVar12 != (int *)0x0) {
    sqlite3DbFreeNN(pParse->db,piVar12);
  }
  if (p_01 != (byte *)0x0) {
    sqlite3DbFreeNN(pParse->db,p_01);
  }
  return;
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  int eType;            /* Type of the RHS */
  int rLhs;             /* Register(s) holding the LHS values */
  int rLhsOrig;         /* LHS values prior to reordering by aiMap[] */
  Vdbe *v;              /* Statement under construction */
  int *aiMap = 0;       /* Map from vector field to index column */
  char *zAff = 0;       /* Affinity string for comparisons */
  int nVector;          /* Size of vectors for this IN operator */
  int iDummy;           /* Dummy parameter to exprCodeVector() */
  Expr *pLeft;          /* The LHS of the IN operator */
  int i;                /* loop counter */
  int destStep2;        /* Where to jump when NULLs seen in step 2 */
  int destStep6 = 0;    /* Start of code for Step 6 */
  int addrTruthOp;      /* Address of opcode that determines the IN is true */
  int destNotNull;      /* Jump here if a comparison is not true in step 6 */
  int addrTop;          /* Top of the step-6 loop */ 

  pLeft = pExpr->pLeft;
  if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
  zAff = exprINAffinity(pParse, pExpr);
  nVector = sqlite3ExprVectorSize(pExpr->pLeft);
  aiMap = (int*)sqlite3DbMallocZero(
      pParse->db, nVector*(sizeof(int) + sizeof(char)) + 1
  );
  if( pParse->db->mallocFailed ) goto sqlite3ExprCodeIN_oom_error;

  /* Attempt to compute the RHS. After this step, if anything other than
  ** IN_INDEX_NOOP is returned, the table opened ith cursor pExpr->iTable 
  ** contains the values that make up the RHS. If IN_INDEX_NOOP is returned,
  ** the RHS has not yet been coded.  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr,
                             IN_INDEX_MEMBERSHIP | IN_INDEX_NOOP_OK,
                             destIfFalse==destIfNull ? 0 : &rRhsHasNull, aiMap);

  assert( pParse->nErr || nVector==1 || eType==IN_INDEX_EPH
       || eType==IN_INDEX_INDEX_ASC || eType==IN_INDEX_INDEX_DESC 
  );
#ifdef SQLITE_DEBUG
  /* Confirm that aiMap[] contains nVector integer values between 0 and
  ** nVector-1. */
  for(i=0; i<nVector; i++){
    int j, cnt;
    for(cnt=j=0; j<nVector; j++) if( aiMap[j]==i ) cnt++;
    assert( cnt==1 );
  }
#endif

  /* Code the LHS, the <expr> from "<expr> IN (...)". If the LHS is a 
  ** vector, then it is stored in an array of nVector registers starting 
  ** at r1.
  **
  ** sqlite3FindInIndex() might have reordered the fields of the LHS vector
  ** so that the fields are in the same order as an existing index.   The
  ** aiMap[] array contains a mapping from the original LHS field order to
  ** the field order that matches the RHS index.
  */
  sqlite3ExprCachePush(pParse);
  rLhsOrig = exprCodeVector(pParse, pLeft, &iDummy);
  for(i=0; i<nVector && aiMap[i]==i; i++){} /* Are LHS fields reordered? */
  if( i==nVector ){
    /* LHS fields are not reordered */
    rLhs = rLhsOrig;
  }else{
    /* Need to reorder the LHS fields according to aiMap */
    rLhs = sqlite3GetTempRange(pParse, nVector);
    for(i=0; i<nVector; i++){
      sqlite3VdbeAddOp3(v, OP_Copy, rLhsOrig+i, rLhs+aiMap[i], 0);
    }
  }

  /* If sqlite3FindInIndex() did not find or create an index that is
  ** suitable for evaluating the IN operator, then evaluate using a
  ** sequence of comparisons.
  **
  ** This is step (1) in the in-operator.md optimized algorithm.
  */
  if( eType==IN_INDEX_NOOP ){
    ExprList *pList = pExpr->x.pList;
    CollSeq *pColl = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    int labelOk = sqlite3VdbeMakeLabel(v);
    int r2, regToFree;
    int regCkNull = 0;
    int ii;
    assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
    if( destIfNull!=destIfFalse ){
      regCkNull = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_BitAnd, rLhs, rLhs, regCkNull);
    }
    for(ii=0; ii<pList->nExpr; ii++){
      r2 = sqlite3ExprCodeTemp(pParse, pList->a[ii].pExpr, &regToFree);
      if( regCkNull && sqlite3ExprCanBeNull(pList->a[ii].pExpr) ){
        sqlite3VdbeAddOp3(v, OP_BitAnd, regCkNull, r2, regCkNull);
      }
      if( ii<pList->nExpr-1 || destIfNull!=destIfFalse ){
        sqlite3VdbeAddOp4(v, OP_Eq, rLhs, labelOk, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, ii<pList->nExpr-1);
        VdbeCoverageIf(v, ii==pList->nExpr-1);
        sqlite3VdbeChangeP5(v, zAff[0]);
      }else{
        assert( destIfNull==destIfFalse );
        sqlite3VdbeAddOp4(v, OP_Ne, rLhs, destIfFalse, r2,
                          (void*)pColl, P4_COLLSEQ); VdbeCoverage(v);
        sqlite3VdbeChangeP5(v, zAff[0] | SQLITE_JUMPIFNULL);
      }
      sqlite3ReleaseTempReg(pParse, regToFree);
    }
    if( regCkNull ){
      sqlite3VdbeAddOp2(v, OP_IsNull, regCkNull, destIfNull); VdbeCoverage(v);
      sqlite3VdbeGoto(v, destIfFalse);
    }
    sqlite3VdbeResolveLabel(v, labelOk);
    sqlite3ReleaseTempReg(pParse, regCkNull);
    goto sqlite3ExprCodeIN_finished;
  }

  /* Step 2: Check to see if the LHS contains any NULL columns.  If the
  ** LHS does contain NULLs then the result must be either FALSE or NULL.
  ** We will then skip the binary search of the RHS.
  */
  if( destIfNull==destIfFalse ){
    destStep2 = destIfFalse;
  }else{
    destStep2 = destStep6 = sqlite3VdbeMakeLabel(v);
  }
  for(i=0; i<nVector; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pExpr->pLeft, i);
    if( sqlite3ExprCanBeNull(p) ){
      sqlite3VdbeAddOp2(v, OP_IsNull, rLhs+i, destStep2);
      VdbeCoverage(v);
    }
  }

  /* Step 3.  The LHS is now known to be non-NULL.  Do the binary search
  ** of the RHS using the LHS as a probe.  If found, the result is
  ** true.
  */
  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree and so we also
    ** know that the RHS is non-NULL.  Hence, we combine steps 3 and 4
    ** into a single opcode. */
    sqlite3VdbeAddOp3(v, OP_SeekRowid, pExpr->iTable, destIfFalse, rLhs);
    VdbeCoverage(v);
    addrTruthOp = sqlite3VdbeAddOp0(v, OP_Goto);  /* Return True */
  }else{
    sqlite3VdbeAddOp4(v, OP_Affinity, rLhs, nVector, 0, zAff, nVector);
    if( destIfFalse==destIfNull ){
      /* Combine Step 3 and Step 5 into a single opcode */
      sqlite3VdbeAddOp4Int(v, OP_NotFound, pExpr->iTable, destIfFalse,
                           rLhs, nVector); VdbeCoverage(v);
      goto sqlite3ExprCodeIN_finished;
    }
    /* Ordinary Step 3, for the case where FALSE and NULL are distinct */
    addrTruthOp = sqlite3VdbeAddOp4Int(v, OP_Found, pExpr->iTable, 0,
                                      rLhs, nVector); VdbeCoverage(v);
  }

  /* Step 4.  If the RHS is known to be non-NULL and we did not find
  ** an match on the search above, then the result must be FALSE.
  */
  if( rRhsHasNull && nVector==1 ){
    sqlite3VdbeAddOp2(v, OP_NotNull, rRhsHasNull, destIfFalse);
    VdbeCoverage(v);
  }

  /* Step 5.  If we do not care about the difference between NULL and
  ** FALSE, then just return false. 
  */
  if( destIfFalse==destIfNull ) sqlite3VdbeGoto(v, destIfFalse);

  /* Step 6: Loop through rows of the RHS.  Compare each row to the LHS.
  ** If any comparison is NULL, then the result is NULL.  If all
  ** comparisons are FALSE then the final result is FALSE.
  **
  ** For a scalar LHS, it is sufficient to check just the first row
  ** of the RHS.
  */
  if( destStep6 ) sqlite3VdbeResolveLabel(v, destStep6);
  addrTop = sqlite3VdbeAddOp2(v, OP_Rewind, pExpr->iTable, destIfFalse);
  VdbeCoverage(v);
  if( nVector>1 ){
    destNotNull = sqlite3VdbeMakeLabel(v);
  }else{
    /* For nVector==1, combine steps 6 and 7 by immediately returning
    ** FALSE if the first comparison is not NULL */
    destNotNull = destIfFalse;
  }
  for(i=0; i<nVector; i++){
    Expr *p;
    CollSeq *pColl;
    int r3 = sqlite3GetTempReg(pParse);
    p = sqlite3VectorFieldSubexpr(pLeft, i);
    pColl = sqlite3ExprCollSeq(pParse, p);
    sqlite3VdbeAddOp3(v, OP_Column, pExpr->iTable, i, r3);
    sqlite3VdbeAddOp4(v, OP_Ne, rLhs+i, destNotNull, r3,
                      (void*)pColl, P4_COLLSEQ);
    VdbeCoverage(v);
    sqlite3ReleaseTempReg(pParse, r3);
  }
  sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
  if( nVector>1 ){
    sqlite3VdbeResolveLabel(v, destNotNull);
    sqlite3VdbeAddOp2(v, OP_Next, pExpr->iTable, addrTop+1);
    VdbeCoverage(v);

    /* Step 7:  If we reach this point, we know that the result must
    ** be false. */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);
  }

  /* Jumps here in order to return true. */
  sqlite3VdbeJumpHere(v, addrTruthOp);

sqlite3ExprCodeIN_finished:
  if( rLhs!=rLhsOrig ) sqlite3ReleaseTempReg(pParse, rLhs);
  sqlite3ExprCachePop(pParse);
  VdbeComment((v, "end IN expr"));
sqlite3ExprCodeIN_oom_error:
  sqlite3DbFree(pParse->db, aiMap);
  sqlite3DbFree(pParse->db, zAff);
}